

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allmain.c
# Opt level: O2

int command_input(int cmdidx,int rep,nh_cmd_arg *arg)

{
  char cVar1;
  bool bVar2;
  xchar x;
  xchar y;
  schar sVar3;
  schar sVar4;
  boolean bVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  _func_int *p_Var13;
  char *pcVar14;
  boolean bVar15;
  uint uVar16;
  char *__format;
  short sVar17;
  monst *mon;
  ulong uVar18;
  char *pcVar19;
  char *pcVar20;
  char *pcVar21;
  ulong uStack_50;
  
  if (occupation == (_func_int *)0x0 || multi < 0) {
    if ((multi == 0) || (cmdidx != -1 && 0 < multi)) {
      bVar15 = '\x01';
      saved_cmd = cmdidx;
LAB_0013f2c4:
      do_command(saved_cmd,rep,bVar15,arg);
    }
    else if (0 < multi) {
      if (rep == -1) {
        nomul(0,(char *)0x0);
        return 0;
      }
      if (flags.mv == '\0') {
        bVar15 = '\0';
        rep = multi;
        goto LAB_0013f2c4;
      }
      if (((uint)multi < 0x50) && (multi = multi + -1, multi == 0)) {
        flags.run = 0;
        flags.mv = '\0';
        iflags.travel1 = '\0';
        flags.travel = '\0';
      }
      iVar7 = domove(u.dx,u.dy,'\0');
      if (iVar7 == 0) {
        flags.move = '\0';
        nomul(0,(char *)0x0);
      }
    }
  }
  else {
    iVar7 = (*occupation)();
    if (iVar7 == 0) {
      occupation = (_func_int *)0x0;
    }
    iVar7 = monster_nearby();
    if (iVar7 != 0) {
      stop_occupation();
      reset_eat();
    }
  }
  if (u.utotype == '\0') {
    if ((flags.move == '\0') || (flags.mv == '\0')) {
      iflags.botl = '\x01';
    }
  }
  else {
    deferred_goto();
  }
  if (vision_full_recalc != '\0') {
    vision_recalc(0);
  }
  if (multi != 0 && (iflags.runmode == 0 || flags.run == 0)) {
    if (flags.travel == '\0') {
      uVar16 = multi % 7;
    }
    else {
      uVar16 = moves % 7;
    }
    if (uVar16 == 0) {
      if (flags.run != 0) {
        iflags.botl = '\x01';
      }
      flush_screen();
    }
  }
  bVar15 = flags.move;
  if (flags.move != '\0') {
    if (delay_start == 0) {
      delay_start = moves;
    }
    youmonst.movement = youmonst.movement + -0xc;
    iVar7 = 0;
    do {
      uVar16 = encumber_msg();
      calc_attr_bonus();
      validate_timers();
      validate_light_sources();
      flags.mon_moving = '\x01';
      do {
        iVar8 = movemon();
        if (0xc < youmonst.movement) break;
      } while ((char)iVar8 != '\0');
      flags.mon_moving = '\0';
      if (0xb < youmonst.movement || (char)iVar8 != '\0') goto LAB_0013fbb9;
      mcalcdistress();
      mon = (monst *)&level->monlist;
      while (mon = mon->nmon, mon != (monst *)0x0) {
        iVar8 = mcalcmove(mon);
        mon->movement = mon->movement + (short)iVar8;
      }
      iVar8 = 0x19;
      if ((u.uevent._1_1_ & 0x20) == 0) {
        sVar3 = depth(&u.uz);
        sVar4 = depth(&dungeon_topology.d_stronghold_level);
        iVar8 = 0x46;
        if (sVar4 < sVar3) {
          iVar8 = 0x32;
        }
      }
      iVar8 = rn2(iVar8);
      if (iVar8 == 0) {
        makemon((permonst *)0x0,level,0,0,0);
      }
      if ((u.usteed == (monst *)0x0) || (u.umoved == '\0')) {
        uVar12 = (uint)(youmonst.data)->mmove;
        uVar18 = (ulong)uVar12;
        if ((u.uprops[0x1a].intrinsic & 0xf8ffffff) == 0 && u.uprops[0x1a].extrinsic == 0) {
          if (u.uprops[0x1a].intrinsic != 0) {
            uVar10 = mt_random();
            uVar9 = uVar12 + 6;
            if (uVar10 % 3 == 0) {
              uVar9 = uVar12;
            }
            goto LAB_0013f4f9;
          }
        }
        else {
          uVar10 = mt_random();
          uVar9 = uVar12 + 0xc;
          if (uVar10 % 3 != 0) {
            uVar9 = uVar12 + 6;
          }
          uVar18 = (ulong)uVar9;
        }
      }
      else {
        uVar9 = mcalcmove(u.usteed);
LAB_0013f4f9:
        uVar18 = (ulong)uVar9;
      }
      iVar8 = (int)uVar18;
      switch(uVar16) {
      case 1:
        goto LAB_0013f51e;
      case 2:
        uVar12 = iVar8 >> 0x1f;
        iVar11 = -2;
        break;
      case 3:
        uVar18 = (ulong)(uint)(iVar8 * 3);
LAB_0013f51e:
        uVar12 = (int)uVar18 >> 0x1f;
        iVar11 = -4;
        break;
      case 4:
        uVar18 = (ulong)(uint)(iVar8 * 7);
        uVar12 = iVar8 * 7 >> 0x1f;
        iVar11 = -8;
        break;
      default:
        goto switchD_0013f513_default;
      }
      uVar18 = (ulong)(uint)((int)((long)((ulong)uVar12 << 0x20 | uVar18) / (long)iVar11) + iVar8);
switchD_0013f513_default:
      sVar17 = (short)uVar18 + youmonst.movement;
      youmonst.movement = 0;
      if (0 < sVar17) {
        youmonst.movement = sVar17;
      }
      settrack();
      moves = moves + 1;
      level->lastmoves = moves;
      if (flags.bypasses != '\0') {
        clear_bypasses();
      }
      if (u.uprops[0x29].intrinsic != 0) {
        glibr();
      }
      nh_timeout();
      run_regions(level);
      dgn_growths(level,'\x01','\x01');
      train_body_armor_skill();
      train_shield_skill();
      if (u.ublesscnt != 0) {
        u.ublesscnt = u.ublesscnt + -1;
      }
      iflags.botl = '\x01';
      uVar12 = 0;
      if ((u._1052_1_ & 0x10) == 0) {
        uVar12 = uVar16;
        if ((((u.umonnum == u.umonster) || ((youmonst.data)->mlet != '9')) ||
            (bVar5 = is_pool(level,(int)u.ux,(int)u.uy), bVar5 != '\0')) ||
           (bVar5 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar5 != '\0')) {
          if ((u.umonnum == u.umonster) || (u.mhmax <= u.mh)) {
            if ((u.uhp < u.uhpmax) &&
               (((u.uprops[10].extrinsic != 0 || u.uprops[10].intrinsic != 0) ||
                 (u.umoved == '\0' || (int)uVar16 < 2) ||
                (((youmonst.data)->mflags1 & 0x800000) != 0)))) {
              if ((u.ulevel < 10) || (moves % 3 != 0)) {
                if (((u.uprops[10].intrinsic == 0 && u.uprops[10].extrinsic == 0) &&
                    (((youmonst.data)->mflags1 & 0x800000) == 0)) &&
                   ((9 < u.ulevel || (moves % ((int)(0x2a / (long)(u.ulevel + 2)) + 1U) != 0))))
                goto LAB_0013f7f1;
                iVar8 = u.uhp + 1;
                iVar11 = u.uhpmax;
                u.uhp = iVar8;
              }
              else {
                bVar6 = acurr(4);
                iVar8 = 1;
                if ('\f' < (char)bVar6) {
                  iVar11 = rnd((uint)bVar6);
                  iVar8 = u.ulevel + -9;
                  if (iVar11 < u.ulevel + -9) {
                    iVar8 = iVar11;
                  }
                }
                iVar8 = iVar8 + u.uhp;
                iVar11 = u.uhpmax;
                u.uhp = iVar8;
                if (u.uhpmax <= iVar8) {
                  iVar8 = u.uhpmax;
                  u.uhp = u.uhpmax;
                }
              }
LAB_0013f770:
              iflags.botl = '\x01';
              interrupt_multi("Hit points",iVar8,iVar11);
            }
          }
          else {
            if (u.mh < 1) goto LAB_0013f7e9;
            if (((u.uprops[10].extrinsic != 0 || u.uprops[10].intrinsic != 0) ||
                (((youmonst.data)->mflags1 & 0x800000) != 0)) ||
               (((int)uVar16 < 2 && (moves % 0x14 == 0)))) {
              iVar8 = u.mh + 1;
              iVar11 = u.mhmax;
              u.mh = iVar8;
              goto LAB_0013f770;
            }
          }
        }
        else if (u.mh < 2) {
          if (u.mh != 1) {
LAB_0013f7e9:
            rehumanize();
          }
        }
        else {
          u.mh = u.mh + -1;
          iflags.botl = '\x01';
        }
      }
LAB_0013f7f1:
      if ((2 < (int)uVar12) && (u.umoved != '\0')) {
        if (uVar12 < 4) {
          uStack_50 = 0x1e;
        }
        else {
          uStack_50 = 10;
        }
        if ((int)((ulong)moves % uStack_50) == 0) {
          if (u.mh < 2 || u.umonnum == u.umonster) {
            if (u.uhp < 2 || u.umonnum != u.umonster) {
              pline("You pass out from exertion!");
              exercise(4,'\0');
              fall_asleep(-10,'\0');
            }
            else {
              u.uhp = u.uhp + -1;
            }
          }
          else {
            u.mh = u.mh + -1;
          }
        }
      }
      if ((u.uen < u.uenmax) &&
         (((((int)uVar12 < 2 &&
            ((int)((ulong)moves %
                  ((long)(int)(((urole.malenum != 0x168) + 3) * (0x26 - u.ulevel)) / 6 & 0xffffffffU
                  )) == 0)) || (u.uprops[0x30].intrinsic != 0)) || (u.uprops[0x30].extrinsic != 0)))
         ) {
        sVar3 = acurr(2);
        sVar4 = acurr(1);
        iVar8 = rn2((int)(short)((short)((short)sVar4 + (short)sVar3) / 0xf + 1));
        u.uen = iVar8 + u.uen + 1;
        if (u.uenmax <= u.uen) {
          u.uen = u.uenmax;
        }
        iflags.botl = '\x01';
        interrupt_multi("Magic energy",u.uen,u.uenmax);
      }
      if ((u._1052_1_ & 0x10) == 0) {
        if ((((u.uprops[0xe].extrinsic != 0 || u.uprops[0xe].intrinsic != 0) ||
             (((youmonst.data)->mflags1 & 0x2000000) != 0)) &&
            ((uVar16 = mt_random(), y = u.uy, x = u.ux, uVar16 % 0x55 == 0 &&
             ((tele((char *)0x0), u.ux != x || (u.uy != y)))))) &&
           (bVar5 = next_to_u(), bVar5 == '\0')) {
          check_leash(x,y);
        }
        if (((iVar7 == 1 && u.uprops[0x10].intrinsic == 0) && u.uprops[0x10].extrinsic == 0) ||
           ((iVar7 == 2 && (u.ulycn == -1)))) {
          iVar7 = 0;
        }
        if (u.uprops[0x10].intrinsic == 0 && u.uprops[0x10].extrinsic == 0) {
LAB_0013fa07:
          iVar8 = iVar7;
          if ((-1 < u.ulycn) && (u.umonnum == u.umonster)) {
            iVar7 = night();
            iVar7 = rn2(iVar7 * -0x14 + 0x50);
            if (iVar7 == 0) {
              iVar8 = 2;
            }
          }
        }
        else {
          uVar16 = mt_random();
          iVar8 = 1;
          if (uVar16 % 100 != 0) goto LAB_0013fa07;
        }
        iVar7 = iVar8;
        if ((((iVar7 != 0) && (u.uprops[0x3d].intrinsic == 0)) && (u.uprops[0x3d].extrinsic == 0))
           && (-1 < multi)) {
          if (occupation == (_func_int *)0x0) {
            nomul(0,(char *)0x0);
          }
          else {
            stop_occupation();
          }
          if (iVar7 == 1) {
            iVar7 = 0;
            polyself('\0');
          }
          else {
            you_were();
            iVar7 = 0;
          }
        }
      }
      if ((u.uprops[0xb].extrinsic != 0 || u.uprops[0xb].intrinsic != 0) && (-1 < multi)) {
        dosearch0(1);
      }
      dosounds();
      do_storms();
      gethungry();
      age_spells();
      exerchk();
      invault();
      if ((u.uhave._0_1_ & 1) != 0) {
        amulet();
      }
      sVar3 = acurr(3);
      iVar8 = rn2(sVar3 * 3 + 0x28);
      if (iVar8 == 0) {
        iVar8 = rnd(3);
        u_wipe_engr(iVar8);
      }
      if ((((u.uevent._1_1_ & 0x20) != 0) && ((u._1052_1_ & 0x10) == 0)) &&
         ((u.udg_cnt == 0 || (u.udg_cnt = u.udg_cnt - 1, u.udg_cnt == 0)))) {
        intervene();
        uVar16 = mt_random();
        u.udg_cnt = uVar16 % 200 + 0x32;
      }
      restore_attrib();
      bVar5 = on_level(&u.uz,&dungeon_topology.d_water_level);
      if (bVar5 == '\0') {
        if ((u._1052_1_ & 2) == 0) {
          if ((u._1052_1_ & 0x20) != 0) {
            under_ground(0);
          }
        }
        else {
          under_water(0);
        }
      }
      else {
        movebubbles();
      }
      if (((multi < 0) && (multi = multi + 1, multi == 0)) &&
         (unmul((char *)0x0), u.utotype != '\0')) {
        deferred_goto();
      }
LAB_0013fbb9:
    } while (youmonst.movement < 0xc);
    if ((u.utrap != 0) && (u.utraptype == 3)) {
      bVar5 = is_lava(level,(int)u.ux,(int)u.uy);
      if (bVar5 == '\0') {
        u.utrap = 0;
      }
      else if ((u._1052_1_ & 0x10) == 0) {
        u.utrap = u.utrap - 0x100;
        if (u.utrap < 0x100) {
          killer_format = 1;
          killer = "molten lava";
          pline("You sink below the surface and die.");
          done(6);
        }
        else if (u.umoved == '\0') {
          Norep("You sink deeper into the lava.");
          iVar7 = rnd(4);
          u.utrap = u.utrap + iVar7;
        }
      }
    }
    iVar7 = prev_hp_notify;
    if ((iflags.hp_notify != '\0') && (iVar8 = uhp(), iVar7 != iVar8)) {
      pcVar21 = "[HP%c%a=%h]";
      if (iflags.hp_notify_fmt != (char *)0x0) {
        pcVar21 = iflags.hp_notify_fmt;
      }
      hp_notify_format_str_buf = 0;
      pcVar19 = &hp_notify_format_str_buf;
      bVar2 = false;
      for (; iVar7 = prev_hp_notify, cVar1 = *pcVar21, cVar1 != '\0'; pcVar21 = pcVar21 + 1) {
        pcVar20 = pcVar19;
        if (&DAT_00312406 < pcVar19) {
          pcVar20 = &DAT_00312406;
        }
        if (bVar2) {
          if (cVar1 == 'H') {
            iVar7 = uhp();
            iVar8 = uhpmax();
            if (iVar7 == iVar8) {
              __format = "%s";
              pcVar14 = "max";
            }
            else {
              iVar7 = uhp();
              pcVar14 = (char *)(long)iVar7;
              __format = "%ld";
            }
            snprintf(pcVar20,0x312407 - (long)pcVar20,__format,pcVar14);
            if ((char *)0x312405 < pcVar19) {
              pcVar19 = &DAT_00312406;
            }
            pcVar19 = pcVar19 + -1;
            do {
              pcVar20 = pcVar19 + 1;
              pcVar19 = pcVar19 + 1;
            } while (*pcVar20 != '\0');
          }
          else if (cVar1 == 'm') {
            iVar7 = uhpmax();
            snprintf(pcVar20,0x312407 - (long)pcVar20,"%ld",(long)iVar7);
            if ((char *)0x312405 < pcVar19) {
              pcVar19 = &DAT_00312406;
            }
            pcVar19 = pcVar19 + -1;
            do {
              pcVar20 = pcVar19 + 1;
              pcVar19 = pcVar19 + 1;
            } while (*pcVar20 != '\0');
          }
          else {
            if (cVar1 == 'c') {
              iVar8 = uhp();
              bVar2 = false;
              snprintf(pcVar20,0x312407 - (long)pcVar20,"%c",
                       (ulong)((uint)(iVar8 < iVar7) * 2 + 0x2b));
              pcVar19 = pcVar20 + 1;
              goto LAB_0013ff31;
            }
            if (cVar1 == 'h') {
              iVar7 = uhp();
              snprintf(pcVar20,0x312407 - (long)pcVar20,"%ld",(long)iVar7);
              if ((char *)0x312405 < pcVar19) {
                pcVar19 = &DAT_00312406;
              }
              pcVar19 = pcVar19 + -1;
              do {
                pcVar20 = pcVar19 + 1;
                pcVar19 = pcVar19 + 1;
              } while (*pcVar20 != '\0');
            }
            else {
              if (cVar1 != 'a') goto LAB_0013fde7;
              iVar7 = uhp();
              uVar12 = iVar7 - prev_hp_notify;
              uVar16 = -uVar12;
              if (0 < (int)uVar12) {
                uVar16 = uVar12;
              }
              snprintf(pcVar20,0x312407 - (long)pcVar20,"%ld",(ulong)uVar16);
              if ((char *)0x312405 < pcVar19) {
                pcVar19 = &DAT_00312406;
              }
              pcVar19 = pcVar19 + -1;
              do {
                pcVar20 = pcVar19 + 1;
                pcVar19 = pcVar19 + 1;
              } while (*pcVar20 != '\0');
            }
          }
LAB_0013ff2f:
          bVar2 = false;
        }
        else {
          bVar2 = true;
          pcVar19 = pcVar20;
          if (cVar1 != '%') {
LAB_0013fde7:
            *pcVar20 = cVar1;
            pcVar19 = pcVar20 + (pcVar20 < &DAT_00312406);
            goto LAB_0013ff2f;
          }
        }
LAB_0013ff31:
      }
      *pcVar19 = '\0';
      pline("%s",&hp_notify_format_str_buf);
      prev_hp_notify = uhp();
    }
  }
  xmalloc_cleanup();
  iflags.next_msg_nonblocking = '\0';
  flags.move = '\x01';
  pre_move_tasks(bVar15);
  p_Var13 = occupation;
  iVar7 = multi;
  if (flags.run == 0) {
    if ((delay_start == 0) || (multi != 0 || occupation != (_func_int *)0x0)) goto LAB_0013ffac;
    if ((iflags.delay_msg == '\0') || (moves - delay_start < 2)) {
      p_Var13 = (_func_int *)0x0;
      iVar7 = 0;
    }
    else {
      pline("[%d turns]");
      p_Var13 = occupation;
      iVar7 = multi;
    }
  }
  delay_start = 0;
LAB_0013ffac:
  if ((iVar7 == 0) && (p_Var13 == (_func_int *)0x0)) {
    flush_screen();
    maybe_tutorial();
  }
  return -1;
}

Assistant:

int command_input(int cmdidx, int rep, struct nh_cmd_arg *arg)
{
    boolean didmove = FALSE;
    
    if (multi >= 0 && occupation)
	handle_occupation();
    else if (multi == 0 || (multi > 0 && cmdidx != -1)) {
	saved_cmd = cmdidx;
	do_command(cmdidx, rep, TRUE, arg);
    } else if (multi > 0) {
	/* allow interruption of multi-turn commands */
	if (rep == -1) {
	    nomul(0, NULL);
	    return READY_FOR_INPUT;
	}
	
	if (flags.mv) {
	    if (multi < COLNO && !--multi)
		flags.travel = iflags.travel1 = flags.mv = flags.run = 0;
	    if (!domove(u.dx, u.dy, 0)) {
		/* Don't use a move when travelling into an obstacle. */
		flags.move = FALSE;
		nomul(0, NULL);
	    }
	} else
	    do_command(saved_cmd, multi, FALSE, arg);
    }
    /* no need to do anything here for multi < 0 */
    
    if (u.utotype)		/* change dungeon level */
	deferred_goto();	/* after rhack() */
    /* !flags.move here: multiple movement command stopped */
    else if (!flags.move || !flags.mv)
	iflags.botl = 1;

    if (vision_full_recalc)
	vision_recalc(0);	/* vision! */
    /* when running in non-tport mode, this gets done through domove() */
    if ((!flags.run || iflags.runmode == RUN_TPORT) &&
	    (multi && (!flags.travel ? !(multi % 7) : !(moves % 7L)))) {
	if (flags.run)
	    iflags.botl = 1;
	flush_screen();
    }
    
    didmove = flags.move;
    if (didmove) {
	you_moved();
    } /* actual time passed */

    /****************************************/
    /* once-per-player-input things go here */
    /****************************************/
    xmalloc_cleanup();
    iflags.next_msg_nonblocking = FALSE;

    /* prepare for the next move */
    flags.move = 1;
    pre_move_tasks(didmove);
    do_delay_msg();
    if (multi == 0 && !occupation) {
	flush_screen(); /* Flush screen buffer */
	maybe_tutorial();
    }
    
    return -1;
}